

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psset.c
# Opt level: O0

void duckdb_je_psset_remove(psset_t *psset,hpdata_t *ps)

{
  _Bool _Var1;
  psset_t *in_RSI;
  hpdata_t *in_RDI;
  psset_t *unaff_retaddr;
  hpdata_t *in_stack_ffffffffffffffe8;
  
  hpdata_in_psset_set((hpdata_t *)in_RSI,false);
  psset_stats_remove(in_RSI,in_stack_ffffffffffffffe8);
  _Var1 = hpdata_in_psset_alloc_container_get((hpdata_t *)in_RSI);
  if (_Var1) {
    psset_alloc_container_remove(in_RSI,in_stack_ffffffffffffffe8);
  }
  psset_maybe_remove_purge_list(unaff_retaddr,in_RDI);
  _Var1 = hpdata_in_psset_hugify_container_get((hpdata_t *)in_RSI);
  if (_Var1) {
    hpdata_in_psset_hugify_container_set((hpdata_t *)in_RSI,false);
    hpdata_hugify_list_remove
              ((hpdata_hugify_list_t *)&in_RDI[0x15].ql_link_purge,(hpdata_t *)in_RSI);
  }
  return;
}

Assistant:

void
psset_remove(psset_t *psset, hpdata_t *ps) {
	hpdata_in_psset_set(ps, false);

	psset_stats_remove(psset, ps);
	if (hpdata_in_psset_alloc_container_get(ps)) {
		psset_alloc_container_remove(psset, ps);
	}
	psset_maybe_remove_purge_list(psset, ps);
	if (hpdata_in_psset_hugify_container_get(ps)) {
		hpdata_in_psset_hugify_container_set(ps, false);
		hpdata_hugify_list_remove(&psset->to_hugify, ps);
	}
}